

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O3

void chapter3::display_word_count
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *word_count,ostream *os)

{
  ostream *this;
  long *plVar1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (word_count->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Word count:\n",0xc);
  for (; (_Rb_tree_header *)p_Var2 != &(word_count->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\t",1);
    this = std::__ostream_insert<char,std::char_traits<char>>
                     (os,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(this,": ",2);
    plVar1 = (long *)std::ostream::operator<<((ostream *)this,p_Var2[2]._M_color);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  return;
}

Assistant:

inline void chapter3::display_word_count(map<string, int> &word_count, ostream &os) {
    map<string, int>::const_iterator
            itr = word_count.begin(),
            end = word_count.end();

    os << "Word count:\n";
    while (itr != end) {
        os << "\t"
           << itr->first
           << ": "
           << itr->second
           << endl;
        ++itr;
    }
    os << endl;
}